

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

size_t nni_base64_encode(uint8_t *in,size_t in_len,char *out,size_t out_len)

{
  uint8_t local_98 [7];
  uint8_t ch;
  uint8_t encode [65];
  uint8_t *local_48;
  size_t io;
  uint local_38;
  uint32_t v;
  uint rem;
  uint ii;
  size_t out_len_local;
  char *out_local;
  size_t in_len_local;
  uint8_t *in_local;
  
  memcpy(local_98,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",0x41);
  local_48 = (uint8_t *)0x0;
  io._4_4_ = 0;
  local_38 = 0;
  for (v = 0; v < in_len; v = v + 1) {
    io._4_4_ = io._4_4_ << 8 | (uint)in[v];
    local_38 = local_38 + 8;
    while (5 < local_38) {
      local_38 = local_38 - 6;
      if (out_len <= local_48) {
        return 0xffffffffffffffff;
      }
      out[(long)local_48] = local_98[io._4_4_ >> ((byte)local_38 & 0x1f) & 0x3f];
      local_48 = local_48 + 1;
    }
  }
  if (local_38 != 0) {
    if (out_len <= local_48) {
      return 0xffffffffffffffff;
    }
    out[(long)local_48] = local_98[io._4_4_ << (6U - (char)local_38 & 0x1f) & 0x3f];
    local_48 = local_48 + 1;
  }
  while( true ) {
    if (((ulong)local_48 & 3) == 0) {
      if (local_48 < out_len) {
        out[(long)local_48] = '\0';
        in_local = local_48;
      }
      else {
        in_local = (uint8_t *)0xffffffffffffffff;
      }
      return (size_t)in_local;
    }
    if (out_len <= local_48) break;
    out[(long)local_48] = '=';
    local_48 = local_48 + 1;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t
nni_base64_encode(const uint8_t *in, size_t in_len, char *out, size_t out_len)
{
	unsigned ii;
	unsigned rem;
	uint32_t v;
	size_t   io;

	const uint8_t encode[65] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
	                           "abcdefghijklmnopqrstuvwxyz"
	                           "0123456789+/";

	for (io = 0, ii = 0, v = 0, rem = 0; ii < in_len; ii++) {
		uint8_t ch = in[ii];
		v          = (v << 8u) | ch;
		rem += 8;
		while (rem >= 6) {
			rem -= 6;
			if (io >= out_len)
				return (-1);
			out[io++] = encode[(v >> rem) & 63u];
		}
	}

	if (rem) {
		v <<= (6 - rem);
		if (io >= out_len)
			return (-1);
		out[io++] = encode[v & 63u];
	}

	// Pad to a multiple of 3.
	while (io & 3u) {
		if (io >= out_len)
			return (-1);
		out[io++] = '=';
	}

	if (io >= out_len)
		return (-1);

	out[io] = '\0';

	return (io);
}